

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viff.cxx
# Opt level: O1

void __thiscall
vigra::colormap<unsigned_short,_unsigned_char>::colormap
          (colormap<unsigned_short,_unsigned_char> *this,uint numTableElements,uint numTables,
          uint numTableBands)

{
  void *pvVar1;
  ContractViolation *this_00;
  ulong uVar2;
  
  this->m_numTableElements = numTableElements;
  this->m_numTables = numTables;
  this->m_numTableBands = numTableBands;
  uVar2 = (ulong)(numTableElements * numTableBands);
  (this->m_tables).super_void_vector_base.m_data = (void *)0x0;
  (this->m_tables).super_void_vector_base.m_size = uVar2;
  (this->m_tables).super_void_vector_base.m_capacity = uVar2;
  if (numTableElements * numTableBands != 0) {
    pvVar1 = operator_new(uVar2);
    (this->m_tables).super_void_vector_base.m_data = pvVar1;
  }
  if (numTableBands == 1 || numTables == 1) {
    return;
  }
  this_00 = (ContractViolation *)__cxa_allocate_exception(0x28);
  ContractViolation::ContractViolation
            (this_00,"Precondition violation!","numTables or numTableBands must be 1",
             "/workspace/llm4binary/github/license_c_cmakelists/ukoethe[P]vigra/src/impex/viff.cxx",
             0xd2);
  *(undefined ***)this_00 = &PTR__ContractViolation_0015ca28;
  __cxa_throw(this_00,&PreconditionViolation::typeinfo,ContractViolation::~ContractViolation);
}

Assistant:

colormap( const unsigned int numTableElements,
                  const unsigned int numTables,
                  const unsigned int numTableBands )
            : m_numTableElements(numTableElements),
              m_numTables(numTables), m_numTableBands(numTableBands),
              m_tables( numTableElements * numTableBands )
        {
            vigra_precondition( ( numTables == 1 ) || ( numTableBands == 1 ),
                                "numTables or numTableBands must be 1" );
        }